

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O3

QAccessibleInterface * __thiscall QAccessibleMenu::parent(QAccessibleMenu *this)

{
  long lVar1;
  undefined8 *puVar2;
  long *plVar3;
  QWidget *this_00;
  QMenu *this_01;
  QAction *action;
  long lVar4;
  undefined8 *puVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QList<QAction_*> local_90;
  QArrayData *local_78;
  QObject **ppQStack_70;
  undefined1 *local_68;
  QArrayData *local_58;
  undefined8 *puStack_50;
  qsizetype local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))();
  this_01 = (QMenu *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
  action = QMenu::menuAction(this_01);
  if (action != (QAction *)0x0) {
    local_58 = (QArrayData *)0x0;
    puStack_50 = (undefined8 *)0x0;
    local_48 = 0;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    ppQStack_70 = (QObject **)&DAT_aaaaaaaaaaaaaaaa;
    QAction::associatedObjects();
    QList<QObject_*>::reserve((QList<QObject_*> *)&local_58,(qsizetype)(local_68 + 1));
    (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    lVar4 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
    local_90.d.d = *(Data **)(*(long *)(lVar4 + 8) + 0x10);
    QtPrivate::QPodArrayOps<QObject*>::emplace<QObject*&>
              ((QPodArrayOps<QObject*> *)&local_58,local_48,(QObject **)&local_90);
    QList<QObject_*>::end((QList<QObject_*> *)&local_58);
    QtPrivate::QCommonArrayOps<QObject_*>::growAppend
              ((QCommonArrayOps<QObject_*> *)&local_58,ppQStack_70,ppQStack_70 + (long)local_68);
    bVar6 = true;
    if (local_48 != 0) {
      puVar2 = puStack_50 + local_48;
      puVar5 = puStack_50;
      do {
        this_00 = (QWidget *)*puVar5;
        lVar4 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
        if ((lVar4 != 0) ||
           (lVar4 = QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject), lVar4 != 0)) {
          QWidget::actions(&local_90,this_00);
          bVar6 = true;
          if (local_90.d.size != 0) {
            lVar4 = 0;
            do {
              if (local_90.d.size << 3 == lVar4) goto LAB_00518881;
              lVar1 = lVar4 + 8;
              plVar3 = (long *)((long)local_90.d.ptr + lVar4);
              lVar4 = lVar1;
            } while ((QAction *)*plVar3 != action);
            bVar6 = lVar1 == 0;
          }
LAB_00518881:
          if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,8,0x10);
            }
          }
          if (!bVar6) {
            action = (QAction *)getOrCreateMenu(this_00,action);
            bVar6 = false;
            goto LAB_005188d5;
          }
        }
        puVar5 = puVar5 + 1;
      } while (puVar5 != puVar2);
      bVar6 = true;
    }
LAB_005188d5:
    if (local_78 != (QArrayData *)0x0) {
      LOCK();
      (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_78,8,0x10);
      }
    }
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,8,0x10);
      }
    }
    if (!bVar6) goto LAB_0051892b;
  }
  action = (QAction *)QAccessibleWidget::parent(&this->super_QAccessibleWidget);
LAB_0051892b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QAccessibleInterface *)action;
}

Assistant:

QAccessibleInterface *QAccessibleMenu::parent() const
{
    if (QAction *menuAction = menu()->menuAction()) {
        QList<QObject *> parentCandidates;
        const QList<QObject *> associatedObjects = menuAction->associatedObjects();
        parentCandidates.reserve(associatedObjects.size() + 1);
        parentCandidates << menu()->parentWidget() << associatedObjects;
        for (QObject *object : std::as_const(parentCandidates)) {
            if (qobject_cast<QMenu*>(object)
#if QT_CONFIG(menubar)
                || qobject_cast<QMenuBar*>(object)
#endif
                ) {
                QWidget *widget = static_cast<QWidget*>(object);
                if (widget->actions().indexOf(menuAction) != -1)
                    return getOrCreateMenu(widget, menuAction);
            }
        }
    }
    return QAccessibleWidget::parent();
}